

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_finishOp(lua_State *L)

{
  LuaType LVar1;
  ushort uVar2;
  uint uVar3;
  CallInfo *pCVar4;
  Instruction *pIVar5;
  StkId pTVar6;
  GCObject *pGVar7;
  uint uVar8;
  StkId pTVar9;
  int total;
  ulong uVar10;
  bool bVar11;
  
  pCVar4 = L->ci;
  pIVar5 = (pCVar4->u).l.savedpc;
  pTVar9 = (pCVar4->u).l.base;
  uVar3 = pIVar5[-1];
  uVar8 = uVar3 & 0xff;
  switch(uVar8) {
  case 8:
  case 10:
  case 0x25:
    goto switchD_00140304_caseD_8;
  case 9:
  case 0xb:
  case 0x1b:
  case 0x1e:
  case 0x22:
  case 0x23:
  case 0x26:
  case 0x27:
  case 0x28:
switchD_00140304_caseD_9:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x424,"void luaV_finishOp(lua_State *)");
  case 0x1d:
    pTVar6 = L->top;
    pGVar7 = pTVar6[-1].value_.gc;
    pTVar6[-3].value_.gc = pGVar7;
    uVar2 = pTVar6[-1].tt_;
    pTVar6[-3].tt_ = uVar2;
    if (((short)uVar2 < 0) &&
       (((uVar2 & 0x7f) != (ushort)pGVar7->tt ||
        ((pGVar7->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x40d,"void luaV_finishOp(lua_State *)");
    }
    total = (int)((ulong)((long)pTVar6 + (-0x20 - (long)(pTVar9 + (uVar3 >> 0x18)))) >> 4);
    if (1 < total) {
      L->top = pTVar6 + -2;
      luaV_concat(L,total);
    }
    pTVar9 = L->top;
    pTVar6 = (pCVar4->u).l.base;
    uVar10 = (ulong)(uVar3 >> 4 & 0x7f0);
    pGVar7 = pTVar9[-1].value_.gc;
    *(GCObject **)((long)&pTVar6->value_ + uVar10) = pGVar7;
    uVar2 = pTVar9[-1].tt_;
    *(ushort *)((long)&pTVar6->tt_ + uVar10) = uVar2;
    if (((short)uVar2 < 0) &&
       (((uVar2 & 0x7f) != (ushort)pGVar7->tt ||
        ((pGVar7->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x413,"void luaV_finishOp(lua_State *)");
    }
    break;
  case 0x1f:
  case 0x20:
  case 0x21:
    LVar1 = L->top[-1].tt_;
    pTVar9 = L->top + -1;
    if (LVar1 == 0) {
      bVar11 = true;
    }
    else if (LVar1 == 1) {
      bVar11 = (pTVar9->value_).b == 0;
    }
    else {
      bVar11 = false;
    }
    L->top = pTVar9;
    if ((char)pCVar4->callstatus < '\0') {
      if (uVar8 != 0x21) {
        __assert_fail("op == OP_LE",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x400,"void luaV_finishOp(lua_State *)");
      }
      pCVar4->callstatus = pCVar4->callstatus & 0xff7f;
    }
    else {
      bVar11 = (bool)(bVar11 ^ 1);
    }
    pIVar5 = (pCVar4->u).l.savedpc;
    if ((char)*pIVar5 == '\x1e') {
      if ((uVar3 >> 8 & 0x7f) == (uint)bVar11) {
        return;
      }
      (pCVar4->u).l.savedpc = pIVar5 + 1;
      return;
    }
    __assert_fail("((OpCode)(((*ci->u.l.savedpc)&0xff))) == OP_JMP",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x404,"void luaV_finishOp(lua_State *)");
  case 0x24:
    if ((uVar3 & 0xff0000) == 0) {
      return;
    }
    break;
  case 0x29:
    if ((char)*pIVar5 != '*') {
      __assert_fail("((OpCode)(((*ci->u.l.savedpc)&0xff))) == OP_TFORLOOP",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x418,"void luaV_finishOp(lua_State *)");
    }
    break;
  default:
    if (8 < uVar8 - 0x6b) goto switchD_00140304_caseD_9;
    if ((0x16dU >> (uVar8 - 0x6b & 0x1f) & 1) == 0) {
      return;
    }
  case 6:
  case 7:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1c:
    pTVar6 = L->top;
    uVar10 = (ulong)(uVar3 >> 4 & 0x7f0);
    L->top = pTVar6 + -1;
    pGVar7 = pTVar6[-1].value_.gc;
    *(GCObject **)((long)&pTVar9->value_ + uVar10) = pGVar7;
    uVar2 = pTVar6[-1].tt_;
    *(ushort *)((long)&pTVar9->tt_ + uVar10) = uVar2;
    if (-1 < (short)uVar2) {
      return;
    }
    if (((uVar2 & 0x7f) == (ushort)pGVar7->tt) &&
       ((pGVar7->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x3f9,"void luaV_finishOp(lua_State *)");
  }
  L->top = pCVar4->top;
switchD_00140304_caseD_8:
  return;
}

Assistant:

void luaV_finishOp (lua_State *L) {
  CallInfo *ci = L->ci;
  StkId base = ci->u.l.base;
  Instruction inst = *(ci->u.l.savedpc - 1);  /* interrupted instruction */
  OpCode op = GET_OPCODE(inst);
  switch (op) {  /* finish its execution */
    case OP_ADD: case OP_SUB: case OP_MUL: case OP_DIV: case OP_IDIV:
    case OP_BAND: case OP_BOR: case OP_BXOR: case OP_SHL: case OP_SHR:
    case OP_MOD: case OP_POW:
    case OP_UNM: case OP_BNOT: case OP_LEN:
    case OP_RAVI_GETTABUP_SK: 
    case OP_RAVI_GETFIELD: case OP_RAVI_GETI: case OP_RAVI_TABLE_GETFIELD: 
    case OP_RAVI_SELF_SK: case OP_RAVI_TABLE_SELF_SK:
    case OP_GETTABUP: case OP_GETTABLE: case OP_SELF: {
      setobjs2s(L, base + GETARG_A(inst), --L->top);
      break;
    }
    case OP_LE: case OP_LT: case OP_EQ: {
      int res = !l_isfalse(L->top - 1);
      L->top--;
      if (ci->callstatus & CIST_LEQ) {  /* "<=" using "<" instead? */
        lua_assert(op == OP_LE);
        ci->callstatus ^= CIST_LEQ;  /* clear mark */
        res = !res;  /* negate result */
      }
      lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_JMP);
      if (res != GETARG_A(inst))  /* condition failed? */
        ci->u.l.savedpc++;  /* skip jump instruction */
      break;
    }
    case OP_CONCAT: {
      StkId top = L->top - 1;  /* top when 'luaT_trybinTM' was called */
      int b = GETARG_B(inst);      /* first element to concatenate */
      int total = cast_int(top - 1 - (base + b));  /* yet to concatenate */
      setobj2s(L, top - 2, top);  /* put TM result in proper position */
      if (total > 1) {  /* are there elements to concat? */
        L->top = top - 1;  /* top is one after last element (at top-2) */
        luaV_concat(L, total);  /* concat them (may yield again) */
      }
      /* move final result to final position */
      setobj2s(L, ci->u.l.base + GETARG_A(inst), L->top - 1);
      L->top = ci->top;  /* restore top */
      break;
    }
    case OP_TFORCALL: {
      lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_TFORLOOP);
      L->top = ci->top;  /* correct top */
      break;
    }
    case OP_CALL: {
      if (GETARG_C(inst) - 1 >= 0)  /* nresults >= 0? */
        L->top = ci->top;  /* adjust results */
      break;
    }
    case OP_RAVI_SETI: case OP_RAVI_TABLE_SETFIELD: case OP_RAVI_SETFIELD:
    case OP_TAILCALL: case OP_SETTABUP: case OP_SETTABLE:
      break;
    default: lua_assert(0);
  }
}